

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Peers.hpp
# Opt level: O2

void __thiscall
ableton::link::
Peers<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_std::reference_wrapper<ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionPeerCounter>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionTimelineCallback>
::setSessionTimeline
          (Peers<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_std::reference_wrapper<ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionPeerCounter>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionTimelineCallback>
           *this,SessionId *sid,Timeline *tl)

{
  element_type *peVar1;
  pointer ppVar2;
  bool bVar3;
  pair<ableton::link::PeerState,_asio::ip::address> *peer;
  pointer ppVar4;
  array<unsigned_char,_8UL> local_30;
  
  peVar1 = (this->mpImpl).
           super___shared_ptr<ableton::link::Peers<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_std::reference_wrapper<ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionPeerCounter>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionTimelineCallback>::Impl,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  ppVar2 = *(pointer *)
            ((long)&(peVar1->mPeers).
                    super__Vector_base<std::pair<ableton::link::PeerState,_asio::ip::address>,_std::allocator<std::pair<ableton::link::PeerState,_asio::ip::address>_>_>
                    ._M_impl.super__Vector_impl_data + 8);
  for (ppVar4 = (peVar1->mPeers).
                super__Vector_base<std::pair<ableton::link::PeerState,_asio::ip::address>,_std::allocator<std::pair<ableton::link::PeerState,_asio::ip::address>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar4 != ppVar2; ppVar4 = ppVar4 + 1) {
    local_30._M_elems = *&(ppVar4->first).nodeState.sessionId.super_NodeIdArray._M_elems;
    bVar3 = std::operator==(&local_30,&sid->super_NodeIdArray);
    if (bVar3) {
      (ppVar4->first).nodeState.timeline.tempo.super_tuple<double>.super__Tuple_impl<0UL,_double>.
      super__Head_base<0UL,_double,_false> =
           (_Head_base<0UL,_double,_false>)
           (tl->tempo).super_tuple<double>.super__Tuple_impl<0UL,_double>.
           super__Head_base<0UL,_double,_false>._M_head_impl;
      (ppVar4->first).nodeState.timeline.beatOrigin.super_tuple<long>.super__Tuple_impl<0UL,_long>.
      super__Head_base<0UL,_long,_false>._M_head_impl =
           (tl->beatOrigin).super_tuple<long>.super__Tuple_impl<0UL,_long>.
           super__Head_base<0UL,_long,_false>._M_head_impl;
      (ppVar4->first).nodeState.timeline.timeOrigin.__r = (tl->timeOrigin).__r;
    }
  }
  return;
}

Assistant:

void setSessionTimeline(const SessionId& sid, const Timeline& tl)
  {
    // Set the cached timeline for all peers to a new client-specified
    // timeline. When we make a timeline change, we do so
    // optimistically and clients assume that all peers in a session
    // have adopted the newly specified timeline. We must represent
    // this in our cache or else we risk failing to notify about a
    // higher-priority peer timeline that was already seen.
    for (auto& peer : mpImpl->mPeers)
    {
      if (peer.first.sessionId() == sid)
      {
        peer.first.nodeState.timeline = tl;
      }
    }
  }